

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

float Lf_CutSwitches(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  float fVar1;
  int local_20;
  float local_1c;
  int i;
  float Switches;
  Lf_Cut_t *pCut_local;
  Lf_Man_t *p_local;
  
  local_1c = 0.0;
  for (local_20 = 0; local_20 < (int)(*(uint *)&pCut->field_0x14 >> 0x18); local_20 = local_20 + 1)
  {
    fVar1 = Lf_ObjSwitches(p,*(int *)((long)&pCut[1].Sign + (long)local_20 * 4));
    local_1c = fVar1 + local_1c;
  }
  return local_1c;
}

Assistant:

static inline float Lf_CutSwitches( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    float Switches = 0; int i; 
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Switches += Lf_ObjSwitches(p, pCut->pLeaves[i]);
//printf( "%.2f ", Switches );
    return Switches;
}